

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O3

BoxFilter * pbrt::BoxFilter::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  Float FVar4;
  Float FVar5;
  string local_38;
  BoxFilter *pBVar3;
  
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"xradius","");
  FVar4 = ParameterDictionary::GetOneFloat(parameters,&local_38,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"yradius","");
  FVar5 = ParameterDictionary::GetOneFloat(parameters,&local_38,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8,4);
  pBVar3 = (BoxFilter *)CONCAT44(extraout_var,iVar2);
  (pBVar3->radius).super_Tuple2<pbrt::Vector2,_float>.x = FVar4;
  (pBVar3->radius).super_Tuple2<pbrt::Vector2,_float>.y = FVar5;
  return pBVar3;
}

Assistant:

BoxFilter *BoxFilter::Create(const ParameterDictionary &parameters, const FileLoc *loc,
                             Allocator alloc) {
    Float xw = parameters.GetOneFloat("xradius", 0.5f);
    Float yw = parameters.GetOneFloat("yradius", 0.5f);
    return alloc.new_object<BoxFilter>(Vector2f(xw, yw));
}